

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

size_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::decode_scan(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
              *this,unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>
                    *process_line,JlsRect *rect,const_byte_span encoded_source)

{
  process_line *ppVar1;
  process_line *ppVar2;
  bool bVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *__s;
  uint8_t *puVar9;
  int iVar10;
  int iVar11;
  
  __s = encoded_source.data_;
  ppVar1 = (process_line->_M_t).
           super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>.
           _M_t.
           super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
           .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
  (process_line->_M_t).
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  ppVar2 = (this->super_decoder_strategy).process_line_._M_t.
           super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>.
           _M_t.
           super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
           .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
  (this->super_decoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = ppVar1;
  if (ppVar2 != (process_line *)0x0) {
    (*ppVar2->_vptr_process_line[1])();
  }
  iVar4 = rect->Y;
  iVar5 = rect->Width;
  iVar6 = rect->Height;
  (this->rect_).X = rect->X;
  (this->rect_).Y = iVar4;
  (this->rect_).Width = iVar5;
  (this->rect_).Height = iVar6;
  (this->super_decoder_strategy).position_ = __s;
  (this->super_decoder_strategy).end_position_ = __s + encoded_source.size_;
  puVar8 = (uint8_t *)memchr(__s,0xff,encoded_source.size_);
  if (puVar8 == (uint8_t *)0x0) {
    puVar8 = __s + encoded_source.size_;
  }
  (this->super_decoder_strategy).position_ff_ = puVar8;
  decoder_strategy::fill_read_cache(&this->super_decoder_strategy);
  if (this->restart_interval_ == 0) {
    this->restart_interval_ = (this->super_decoder_strategy).frame_info_.height;
  }
  decode_lines(this);
  puVar8 = (this->super_decoder_strategy).position_;
  iVar10 = (this->super_decoder_strategy).valid_bits_;
  do {
    puVar9 = puVar8;
    iVar11 = (puVar9[-1] != 0xff) + 7;
    iVar7 = 0;
    if (iVar11 <= iVar10) {
      iVar7 = iVar11;
    }
    bVar3 = iVar11 <= iVar10;
    puVar8 = puVar9 + -1;
    iVar10 = iVar10 - iVar7;
  } while (bVar3);
  return (long)puVar9 - (long)__s;
}

Assistant:

size_t decode_scan(std::unique_ptr<process_line> process_line, const JlsRect& rect, const_byte_span encoded_source)
    {
        Strategy::process_line_ = std::move(process_line);

        const auto* scan_begin{encoded_source.begin()};
        rect_ = rect;

        Strategy::initialize(encoded_source);

        // Process images without a restart interval, as 1 large restart interval.
        if (restart_interval_ == 0)
        {
            restart_interval_ = frame_info().height;
        }

        decode_lines();

        return Strategy::get_cur_byte_pos() - scan_begin;
    }